

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scorer.cc
# Opt level: O1

base_learner * scorer_setup(options_i *options,vw *all)

{
  int iVar1;
  scorer *dat;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ptVar2;
  base_learner *l;
  single_learner *psVar3;
  learner<scorer,_example> *l_00;
  vw_exception *this;
  code *pcVar4;
  string link;
  size_type __dnew;
  option_group_definition new_options;
  stringstream __msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  long local_338;
  option_group_definition local_330;
  long *local_2f8;
  long local_2f0;
  long local_2e8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  string local_2b8;
  undefined6 *local_298;
  undefined8 local_290;
  undefined6 local_288;
  undefined2 uStack_282;
  undefined6 uStack_280;
  undefined1 local_27a;
  string local_278;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_258;
  undefined1 local_1b8 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_130;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_120;
  
  dat = calloc_or_throw<scorer>(1);
  dat->all = (vw *)0x0;
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  local_358._M_string_length = 0;
  local_358.field_2._M_local_buf[0] = '\0';
  uStack_280 = 0x736e6f697470;
  local_288 = 0x7265726f6373;
  uStack_282 = 0x6f20;
  local_290 = 0xe;
  local_27a = 0;
  local_330.m_name._M_dataplus._M_p = (pointer)&local_330.m_name.field_2;
  local_298 = &local_288;
  std::__cxx11::string::_M_construct<char*>((string *)&local_330,&local_288);
  local_330.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_330.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_330.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_298 != &local_288) {
    operator_delete(local_298);
  }
  local_2b8.field_2._M_allocated_capacity._0_4_ = 0x6b6e696c;
  local_2b8._M_string_length = 4;
  local_2b8.field_2._M_local_buf[4] = '\0';
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1b8,&local_2b8,&local_358);
  local_2d8.field_2._M_allocated_capacity = 0x797469746e656469;
  local_2d8._M_string_length = 8;
  local_2d8.field_2._M_local_buf[8] = '\0';
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  ptVar2 = VW::config::
           typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::default_value((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_1b8,&local_2d8);
  (ptVar2->super_base_option).m_keep = true;
  local_338 = 0x3e;
  local_2f8 = local_2e8;
  local_2f8 = (long *)std::__cxx11::string::_M_create((ulong *)&local_2f8,(ulong)&local_338);
  local_2e8[0] = local_338;
  builtin_strncpy((char *)((long)local_2f8 + 0x2e)," glf1 or",8);
  builtin_strncpy((char *)((long)local_2f8 + 0x36)," poisson",8);
  local_2f8[4] = 0x676f6c202c797469;
  local_2f8[5] = 0x67202c6369747369;
  local_2f8[2] = 0x6f6974636e756620;
  local_2f8[3] = 0x746e656469203a6e;
  *local_2f8 = 0x2079666963657053;
  local_2f8[1] = 0x6b6e696c20656874;
  local_2f0 = local_338;
  *(char *)((long)local_2f8 + local_338) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar2->super_base_option).m_help);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_258,ptVar2);
  VW::config::option_group_definition::add<std::__cxx11::string>(&local_330,&local_258);
  local_258.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cb018;
  if (local_258.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_258.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_258.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_258.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_258.super_base_option);
  if (local_2f8 != local_2e8) {
    operator_delete(local_2f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p);
  }
  local_1b8._0_8_ = &PTR__typed_option_002cb018;
  if (local_120._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120._M_pi);
  }
  if (local_130._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_130._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_330);
  dat->all = all;
  l = setup_base(options,all);
  psVar3 = LEARNER::as_singleline<char,char>(l);
  iVar1 = std::__cxx11::string::compare((char *)&local_358);
  if (iVar1 == 0) {
    l_00 = LEARNER::learner<scorer,example>::init_learner<LEARNER::learner<char,example>>
                     (dat,psVar3,predict_or_learn<true,&(id(float))>,
                      predict_or_learn<false,&(id(float))>,1,*(prediction_type_t *)(psVar3 + 0xd0));
    pcVar4 = multipredict<&(id(float))>;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)&local_358);
    if (iVar1 == 0) {
      l_00 = LEARNER::learner<scorer,example>::init_learner<LEARNER::learner<char,example>>
                       (dat,psVar3,predict_or_learn<true,&(logistic(float))>,
                        predict_or_learn<false,&(logistic(float))>,1,
                        *(prediction_type_t *)(psVar3 + 0xd0));
      pcVar4 = multipredict<&(logistic(float))>;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)&local_358);
      if (iVar1 == 0) {
        l_00 = LEARNER::learner<scorer,example>::init_learner<LEARNER::learner<char,example>>
                         (dat,psVar3,predict_or_learn<true,&(glf1(float))>,
                          predict_or_learn<false,&(glf1(float))>,1,
                          *(prediction_type_t *)(psVar3 + 0xd0));
        pcVar4 = multipredict<&(glf1(float))>;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)&local_358);
        if (iVar1 != 0) {
          std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1b8 + 0x10),"Unknown link function: ",0x17);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1b8 + 0x10),local_358._M_dataplus._M_p,
                     local_358._M_string_length);
          this = (vw_exception *)__cxa_allocate_exception(0x38);
          std::__cxx11::stringbuf::str();
          VW::vw_exception::vw_exception
                    (this,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/scorer.cc"
                     ,0x5c,&local_278);
          __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
        }
        l_00 = LEARNER::learner<scorer,example>::init_learner<LEARNER::learner<char,example>>
                         (dat,psVar3,predict_or_learn<true,&expf>,predict_or_learn<false,&expf>,1,
                          *(prediction_type_t *)(psVar3 + 0xd0));
        pcVar4 = multipredict<&expf>;
      }
    }
  }
  *(code **)(l_00 + 0x40) = pcVar4;
  *(code **)(l_00 + 0x38) = update;
  psVar3 = LEARNER::as_singleline<scorer,example>(l_00);
  all->scorer = psVar3;
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_330.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330.m_name._M_dataplus._M_p != &local_330.m_name.field_2) {
    operator_delete(local_330.m_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p);
  }
  return (base_learner *)psVar3;
}

Assistant:

LEARNER::base_learner* scorer_setup(options_i& options, vw& all)
{
  auto s = scoped_calloc_or_throw<scorer>();
  string link;
  option_group_definition new_options("scorer options");
  new_options.add(make_option("link", link)
                      .default_value("identity")
                      .keep()
                      .help("Specify the link function: identity, logistic, glf1 or poisson"));
  options.add_and_parse(new_options);

  // This always returns a base_learner.

  s->all = &all;

  auto base = as_singleline(setup_base(options, all));
  LEARNER::learner<scorer, example>* l;
  void (*multipredict_f)(scorer&, LEARNER::single_learner&, example&, size_t, size_t, polyprediction*, bool) =
      multipredict<id>;

  if (link.compare("identity") == 0)
    l = &init_learner(s, base, predict_or_learn<true, id>, predict_or_learn<false, id>);
  else if (link.compare("logistic") == 0)
  {
    l = &init_learner(s, base, predict_or_learn<true, logistic>, predict_or_learn<false, logistic>);
    multipredict_f = multipredict<logistic>;
  }
  else if (link.compare("glf1") == 0)
  {
    l = &init_learner(s, base, predict_or_learn<true, glf1>, predict_or_learn<false, glf1>);
    multipredict_f = multipredict<glf1>;
  }
  else if (link.compare("poisson") == 0)
  {
    l = &init_learner(s, base, predict_or_learn<true, expf>, predict_or_learn<false, expf>);
    multipredict_f = multipredict<expf>;
  }
  else
    THROW("Unknown link function: " << link);

  l->set_multipredict(multipredict_f);
  l->set_update(update);
  all.scorer = LEARNER::as_singleline(l);

  return make_base(*all.scorer);
}